

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O3

void __thiscall
Kraken::KClient::KClient(KClient *this,string *key,string *secret,string *url,string *version)

{
  pointer pcVar1;
  EVP_PKEY_CTX *ctx;
  
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + key->_M_string_length);
  (this->secret_)._M_dataplus._M_p = (pointer)&(this->secret_).field_2;
  pcVar1 = (secret->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->secret_,pcVar1,pcVar1 + secret->_M_string_length);
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  pcVar1 = (url->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->url_,pcVar1,pcVar1 + url->_M_string_length);
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  ctx = (EVP_PKEY_CTX *)(version->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->version_,ctx,ctx + version->_M_string_length);
  init(this,ctx);
  return;
}

Assistant:

KClient::KClient(const std::string& key, const std::string& secret, 
	   const std::string& url, const std::string& version)
   :key_(key), secret_(secret), url_(url), version_(version) 
{ 
   init(); 
}